

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bus.c
# Opt level: O2

int bus0_sock_get_send_buf_len(void *arg,void *buf,size_t *szp,nni_type t)

{
  int iVar1;
  
  nni_mtx_lock((nni_mtx *)((long)arg + 0x18));
  iVar1 = *(int *)((long)arg + 0xc0);
  nni_mtx_unlock((nni_mtx *)((long)arg + 0x18));
  iVar1 = nni_copyout_int(iVar1,buf,szp,t);
  return iVar1;
}

Assistant:

static int
bus0_sock_get_send_buf_len(void *arg, void *buf, size_t *szp, nni_type t)
{
	bus0_sock *s = arg;
	int        val;
	nni_mtx_lock(&s->mtx);
	val = s->send_buf;
	nni_mtx_unlock(&s->mtx);
	return (nni_copyout_int(val, buf, szp, t));
}